

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt_converter.cpp
# Opt level: O0

uint32_t __thiscall
booster::locale::util::utf8_converter::from_unicode
          (utf8_converter *this,uint32_t u,char *begin,char *end)

{
  bool bVar1;
  long in_RCX;
  char *in_RDX;
  code_point in_ESI;
  ptrdiff_t d;
  int width;
  undefined4 local_4;
  
  bVar1 = utf::is_valid_codepoint(in_ESI);
  if (bVar1) {
    local_4 = utf::utf_traits<char,_1>::width(in_ESI);
    if (in_RCX - (long)in_RDX < (long)(int)local_4) {
      local_4 = 0xfffffffe;
    }
    else {
      utf::utf_traits<char,1>::encode<char*>(in_ESI,in_RDX);
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

virtual uint32_t from_unicode(uint32_t u,char *begin,char const *end) 
        {
            if(!utf::is_valid_codepoint(u))
                return illegal;
            int width = utf::utf_traits<char>::width(u);
            std::ptrdiff_t d=end-begin;
            if(d < width)
                return incomplete;
            utf::utf_traits<char>::encode(u,begin);
            return width;
        }